

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

void repeat_cb(uv_timer_t *handle)

{
  int iVar1;
  uv_timer_t *handle_local;
  
  printf("REPEAT_CB\n");
  if (handle == (uv_timer_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x4a,"handle != NULL");
    abort();
  }
  iVar1 = uv_is_active(handle);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x4b,"1 == uv_is_active((uv_handle_t*) handle)");
    abort();
  }
  repeat_cb_called = repeat_cb_called + 1;
  if (repeat_cb_called == 5) {
    uv_close(handle,repeat_close_cb);
  }
  return;
}

Assistant:

static void repeat_cb(uv_timer_t* handle) {
  printf("REPEAT_CB\n");

  ASSERT(handle != NULL);
  ASSERT(1 == uv_is_active((uv_handle_t*) handle));

  repeat_cb_called++;

  if (repeat_cb_called == 5) {
    uv_close((uv_handle_t*)handle, repeat_close_cb);
  }
}